

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

void Col_StringBufferRelease(Col_Word strbuf,size_t length)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  size_t length_local;
  Col_Word strbuf_local;
  
  if (strbuf == 0) {
    local_1c = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) {
        local_24 = 0xffffffff;
      }
      else {
        local_24 = *(byte *)strbuf & 0xfffffffe;
      }
      local_20 = local_24;
    }
    else {
      local_20 = immediateWordTypes[strbuf & 0x1f];
    }
    local_1c = local_20;
  }
  length_local = strbuf;
  if ((local_1c == 2) && ((*(ushort *)(strbuf + 2) & 0xc) == 0)) {
    length_local = *(size_t *)(strbuf + 0x10);
  }
  if (*(ulong *)(length_local + 0x10) < length) {
    *(undefined8 *)(length_local + 0x10) = 0;
  }
  else {
    *(size_t *)(length_local + 0x10) = *(long *)(length_local + 0x10) - length;
  }
  return;
}

Assistant:

void
Col_StringBufferRelease(
    Col_Word strbuf,    /*!< String buffer to release. */
    size_t length)      /*!< Number of characters to release. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return;

    WORD_UNWRAP(strbuf);

    if (WORD_STRBUF_LENGTH(strbuf) < length) {
        WORD_STRBUF_LENGTH(strbuf) = 0;
    } else {
        /*!
         * @sideeffect
         * Decrease current length.
         */
        WORD_STRBUF_LENGTH(strbuf) -= length;
    }
}